

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void Assimp::ExportSceneObj
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  undefined4 extraout_var_00;
  runtime_error *prVar6;
  ObjExporter exporter;
  allocator local_4d1;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  ObjExporter local_490;
  long *plVar4;
  
  ObjExporter::ObjExporter(&local_490,pFile,pScene,false);
  if ((((&local_490.field_0x20)[*(long *)(local_490._0_8_ + -0x18)] & 5) != 0) ||
     (((&local_490.field_0x198)[*(long *)(local_490._376_8_ + -0x18)] & 5) != 0)) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_4b0,pFile,&local_4d1);
    std::operator+(&local_4d0,"output data creation failed. Most likely the file became too large: "
                   ,&local_4b0);
    std::runtime_error::runtime_error(prVar6,(string *)&local_4d0);
    *(undefined ***)prVar6 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == (long *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_4b0,pFile,&local_4d1);
    std::operator+(&local_4d0,"could not open output .obj file: ",&local_4b0);
    std::runtime_error::runtime_error(prVar6,(string *)&local_4d0);
    *(undefined ***)prVar6 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringbuf::str();
  _Var2._M_p = local_4d0._M_dataplus._M_p;
  uVar5 = std::ostream::tellp();
  (**(code **)(*plVar4 + 0x18))(plVar4,_Var2._M_p,uVar5,1);
  paVar1 = &local_4d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  (**(code **)(*plVar4 + 8))(plVar4);
  ObjExporter::GetMaterialLibFileName_abi_cxx11_(&local_4d0,&local_490);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"wt","");
  iVar3 = (*pIOSystem->_vptr_IOSystem[4])
                    (pIOSystem,local_4d0._M_dataplus._M_p,local_4b0._M_dataplus._M_p);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  if (plVar4 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    _Var2._M_p = local_4d0._M_dataplus._M_p;
    uVar5 = std::ostream::tellp();
    (**(code **)(*plVar4 + 0x18))(plVar4,_Var2._M_p,uVar5,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_4d0._M_dataplus._M_p);
    }
    (**(code **)(*plVar4 + 8))(plVar4);
    ObjExporter::~ObjExporter(&local_490);
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  ObjExporter::GetMaterialLibFileName_abi_cxx11_(&local_4b0,&local_490);
  std::operator+(&local_4d0,"could not open output .mtl file: ",&local_4b0);
  std::runtime_error::runtime_error(prVar6,(string *)&local_4d0);
  *(undefined ***)prVar6 = &PTR__runtime_error_00900168;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneObj(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/) {
    // invoke the exporter
    ObjExporter exporter(pFile, pScene);

    if (exporter.mOutput.fail() || exporter.mOutputMat.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write both the main OBJ file and the material script
    {
        std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
        if(outfile == NULL) {
            throw DeadlyExportError("could not open output .obj file: " + std::string(pFile));
        }
        outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
    }
    {
        std::unique_ptr<IOStream> outfile (pIOSystem->Open(exporter.GetMaterialLibFileName(),"wt"));
        if(outfile == NULL) {
            throw DeadlyExportError("could not open output .mtl file: " + std::string(exporter.GetMaterialLibFileName()));
        }
        outfile->Write( exporter.mOutputMat.str().c_str(), static_cast<size_t>(exporter.mOutputMat.tellp()),1);
    }
}